

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O2

void cpu_put_psr_raw_sparc(CPUSPARCState *env,target_ulong_conflict val)

{
  env->psr = val & 0xf00000;
  env->psref = val >> 0xc & 1;
  env->psrpil = val >> 8 & 0xf;
  env->psrs = val >> 7 & 1;
  env->psrps = val >> 6 & 1;
  env->psret = val >> 5 & 1;
  env->cc_op = 1;
  cpu_set_cwp_sparc(env,val & 0x1f);
  return;
}

Assistant:

void cpu_put_psr_raw(CPUSPARCState *env, target_ulong val)
{
    env->psr = val & PSR_ICC;
#if !defined(TARGET_SPARC64)
    env->psref = (val & PSR_EF) ? 1 : 0;
    env->psrpil = (val & PSR_PIL) >> 8;
    env->psrs = (val & PSR_S) ? 1 : 0;
    env->psrps = (val & PSR_PS) ? 1 : 0;
    env->psret = (val & PSR_ET) ? 1 : 0;
#endif
    env->cc_op = CC_OP_FLAGS;
#if !defined(TARGET_SPARC64)
    cpu_set_cwp(env, val & PSR_CWP);
#endif
}